

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gotcha_dl.c
# Opt level: O1

int lib_header_callback(dl_phdr_info *info,size_t size,void *data)

{
  Elf64_Phdr *pEVar1;
  bool bVar2;
  int iVar3;
  long lVar4;
  ulong uVar5;
  Elf64_Addr EVar6;
  Elf64_Addr *pEVar7;
  char *__s2;
  
  if ((ulong)info->dlpi_phnum == 0) {
    EVar6 = 0;
    __s2 = (char *)0x0;
  }
  else {
    pEVar1 = info->dlpi_phdr;
    lVar4 = 0;
    __s2 = (char *)0x0;
    EVar6 = 0;
    do {
      if (*(int *)((long)&pEVar1->p_type + lVar4) == 1) {
        uVar5 = *(long *)((long)&pEVar1->p_vaddr + lVar4) + info->dlpi_addr;
        bVar2 = true;
        if ((uVar5 <= *data) && (*data < uVar5 + *(long *)((long)&pEVar1->p_memsz + lVar4))) {
          __s2 = info->dlpi_name;
          bVar2 = false;
          EVar6 = info->dlpi_addr;
        }
        if (!bVar2) break;
      }
      lVar4 = lVar4 + 0x38;
    } while ((ulong)info->dlpi_phnum * 0x38 - lVar4 != 0);
  }
  if (__s2 != (char *)0x0) {
    for (pEVar7 = *(Elf64_Addr **)((long)data + 8); pEVar7 != (Elf64_Addr *)0x0;
        pEVar7 = (Elf64_Addr *)pEVar7[3]) {
      iVar3 = strcmp((char *)pEVar7[1],__s2);
      if ((iVar3 == 0) && (EVar6 == *pEVar7)) {
        *(Elf64_Addr **)((long)data + 8) = pEVar7;
        *(undefined4 *)((long)data + 0x10) = 1;
        return 1;
      }
    }
  }
  return 0;
}

Assistant:

int lib_header_callback(struct dl_phdr_info *info, size_t size, void *data) {
  struct Addrs *addrs = data;
  const char *name = NULL;
  ElfW(Addr) load_address = 0;
  for (int i = 0; i < info->dlpi_phnum; ++i) {
    if (info->dlpi_phdr[i].p_type == PT_LOAD) {
      ElfW(Addr) base_addr = info->dlpi_addr;
      ElfW(Addr) start_addr = base_addr + info->dlpi_phdr[i].p_vaddr;
      ElfW(Addr) end_addr = start_addr + info->dlpi_phdr[i].p_memsz;
      if (addrs->lookup_addr >= start_addr && addrs->lookup_addr < end_addr) {
        name = info->dlpi_name;
        load_address = info->dlpi_addr;
        break;
      }
    }
  }
  if (name) {
    struct link_map *current = addrs->lmap;
    while (current) {
      if (strcmp(current->l_name, name) == 0 &&
          load_address == current->l_addr) {
        addrs->lmap = current;
        addrs->found = 1;
        return 1;
      }
      current = current->l_next;  // GCOVR_EXCL_LINE
    }
  }
  return 0;  // GCOVR_EXCL_LINE
}